

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O1

Entry * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
lockEntriesAndGrowIfNeeded
          (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
           *this,size_t *newMemUsed)

{
  pointer *pppEVar1;
  iterator __position;
  uint uVar2;
  bool bVar3;
  Entry *pEVar4;
  Entry *in_RCX;
  Entry *pEVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  Entry *pEStack_28;
  
  do {
    pEVar4 = this->_entries;
    if (pEVar4 == (Entry *)0x0) {
LAB_00117230:
      bVar3 = true;
      pEVar4 = in_RCX;
    }
    else {
      bVar3 = false;
      LOCK();
      bVar9 = pEVar4 == this->_entries;
      if (bVar9) {
        this->_entries = (Entry *)0x0;
      }
      UNLOCK();
      if (!bVar9) goto LAB_00117230;
    }
    in_RCX = pEVar4;
    if (!bVar3) {
      if (this->_numEntries <= this->_size * 2) {
        __position._M_current =
             (this->_oldEntries).
             super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pEStack_28 = in_RCX;
        if (__position._M_current ==
            (this->_oldEntries).
            super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,Ptex::v2_2::PtexReader::FaceData*>::Entry*,std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,Ptex::v2_2::PtexReader::FaceData*>::Entry*>>
          ::
          _M_realloc_insert<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,Ptex::v2_2::PtexReader::FaceData*>::Entry*const&>
                    ((vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,Ptex::v2_2::PtexReader::FaceData*>::Entry*,std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,Ptex::v2_2::PtexReader::FaceData*>::Entry*>>
                      *)&this->_oldEntries,__position,&pEStack_28);
        }
        else {
          *__position._M_current = in_RCX;
          pppEVar1 = &(this->_oldEntries).
                      super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
        uVar2 = this->_numEntries * 2;
        uVar8 = (ulong)uVar2 * 0x10;
        pEVar4 = (Entry *)operator_new__(uVar8);
        if (uVar2 != 0) {
          pEVar5 = pEVar4;
          do {
            (pEVar5->key)._val = -1;
            pEVar5->value = (FaceData *)0x0;
            pEVar5 = pEVar5 + 1;
          } while (pEVar5 != pEVar4 + uVar2);
        }
        *newMemUsed = uVar8;
        if (this->_numEntries != 0) {
          uVar8 = 0;
          do {
            if (pEStack_28[uVar8].value != (FaceData *)0x0) {
              pEVar5 = pEStack_28 + uVar8;
              uVar7 = (pEVar5->key)._val;
              do {
                uVar6 = (uint)uVar7 & uVar2 - 1;
                uVar7 = (ulong)((uint)uVar7 + 1);
              } while (pEVar4[uVar6].value != (FaceData *)0x0);
              pEVar4[uVar6].key._val = (pEVar5->key)._val;
              pEVar4[uVar6].value = pEVar5->value;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < this->_numEntries);
        }
        this->_numEntries = uVar2;
        return pEVar4;
      }
      return in_RCX;
    }
  } while( true );
}

Assistant:

Entry* lockEntriesAndGrowIfNeeded(size_t& newMemUsed)
    {
        Entry* entries = lockEntries();
        if (_size*2 >= _numEntries) {
            entries = grow(entries, newMemUsed);
        }
        return entries;
    }